

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall IRBuilder::InsertLabels(IRBuilder *this)

{
  byte bVar1;
  Kind KVar2;
  long *plVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint32 byteCodeOffset;
  MultiBranchInstr *pMVar8;
  Type *ppBVar9;
  BranchInstr *pBVar10;
  MultiBranchInstr *pMVar11;
  long lVar12;
  int iVar13;
  SList<BranchReloc_*,_Memory::ArenaAllocator,_RealCount> *pSVar14;
  long lVar15;
  ulong uVar16;
  Type pBVar17;
  void **value;
  anon_class_32_1_3fcf6586_for_fn local_c0;
  anon_class_32_1_3fcf6586_for_fn local_a0;
  Type local_80;
  IRBuilder *local_78;
  Iterator local_70;
  undefined1 local_60 [8];
  MultiBranchInstr *multiBranchInstr;
  uint32 local_4c;
  undefined1 local_48 [8];
  BranchInstr *branchInstr;
  uint offset;
  LabelInstr *labelInstr;
  
  pSVar14 = this->branchRelocList;
  if (pSVar14 == (SList<BranchReloc_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    pMVar8 = (MultiBranchInstr *)__tls_get_addr(&PTR_013e5f18);
    *(undefined4 *)&(pMVar8->super_BranchInstr).super_Instr._vptr_Instr = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x3c5,"(this->branchRelocList)","Malformed branch reloc list");
    if (!bVar5) {
LAB_0048f94e:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *(undefined4 *)&(pMVar8->super_BranchInstr).super_Instr._vptr_Instr = 0;
    pSVar14 = this->branchRelocList;
  }
  else {
    pMVar8 = (MultiBranchInstr *)__tls_get_addr(&PTR_013e5f18);
  }
  local_78 = this;
  local_70.list = &pSVar14->super_SListBase<BranchReloc_*,_Memory::ArenaAllocator,_RealCount>;
  local_70.current = (NodeBase *)pSVar14;
  multiBranchInstr = pMVar8;
LAB_0048f63a:
  if ((SList<BranchReloc_*,_Memory::ArenaAllocator,_RealCount> *)local_70.current ==
      (SList<BranchReloc_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)&(pMVar8->super_BranchInstr).super_Instr._vptr_Instr = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x76,"(current != nullptr)","current != nullptr");
    if (!bVar5) goto LAB_0048f94e;
    *(undefined4 *)&(pMVar8->super_BranchInstr).super_Instr._vptr_Instr = 0;
  }
  local_70.current =
       (((SList<BranchReloc_*,_Memory::ArenaAllocator,_RealCount> *)local_70.current)->
       super_SListBase<BranchReloc_*,_Memory::ArenaAllocator,_RealCount>).
       super_SListNodeBase<Memory::ArenaAllocator>.next;
  if ((SListBase<BranchReloc_*,_Memory::ArenaAllocator,_RealCount> *)local_70.current ==
      local_70.list) {
    return;
  }
  _offset = (LabelInstr *)0x0;
  ppBVar9 = SListBase<BranchReloc_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_70);
  pBVar17 = *ppBVar9;
  local_48 = (undefined1  [8])pBVar17->branchInstr;
  branchInstr._0_4_ = pBVar17->offset;
  local_4c = pBVar17->branchOffset;
  branchInstr._4_4_ = (uint)branchInstr;
  bVar5 = IsLoopBody(this);
  if ((bVar5) && (uVar6 = GetLoopBodyExitInstrOffset(this), uVar6 < branchInstr._4_4_)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)&(pMVar8->super_BranchInstr).super_Instr._vptr_Instr = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x3d1,"(!IsLoopBody() || offset <= GetLoopBodyExitInstrOffset())",
                       "!IsLoopBody() || offset <= GetLoopBodyExitInstrOffset()");
    if (!bVar5) goto LAB_0048f94e;
    *(undefined4 *)&(pMVar8->super_BranchInstr).super_Instr._vptr_Instr = 0;
  }
  if (((Instr *)local_48)->m_opcode == MultiBr) {
    local_80 = pBVar17;
    pBVar10 = IR::Instr::AsBranchInstr((Instr *)local_48);
    pMVar11 = IR::BranchInstr::AsMultiBrInstr(pBVar10);
    local_a0.fn.remapped = (bool *)&offset;
    local_a0.fn.this = (MultiBranchInstr *)local_48;
    local_a0.fn.newLabelInstr = (LabelInstr *)local_60;
    plVar3 = (long *)pMVar11->m_branchTargets;
    pBVar17 = local_80;
    pMVar8 = multiBranchInstr;
    uVar7 = branchInstr._4_4_;
    local_a0.fn.oldLabelInstr = (LabelInstr *)this;
    local_60 = (undefined1  [8])pMVar11;
    if (plVar3 != (long *)0x0) {
      KVar2 = pMVar11->m_kind;
      if ((KVar2 == IntJumpTable) || (KVar2 == SingleCharStrJumpTable)) {
        lVar12 = pMVar11->m_baseCaseValue;
        lVar15 = lVar12 * 8 + *plVar3;
        for (; lVar12 <= pMVar11->m_lastCaseValue; lVar12 = lVar12 + 1) {
          anon_func::anon_class_32_1_3fcf6586::anon_class_32_1_3fcf6586_for_fn::
          anon_class_32_1_3fcf6586_for_fn::anon_class_32_1_3fcf6586_for_fn::operator()
                    (&local_a0,(void **)(lVar15 + pMVar11->m_baseCaseValue * -8));
          lVar15 = lVar15 + 8;
        }
        value = (void **)(plVar3 + 1);
        this = local_78;
      }
      else if (KVar2 == StrDictionary) {
        local_c0.fn.remapped = (bool *)&offset;
        local_c0.fn.this = (MultiBranchInstr *)local_48;
        local_c0.fn.newLabelInstr = (LabelInstr *)local_60;
        local_c0.fn.oldLabelInstr = (LabelInstr *)this;
        for (uVar16 = 0; uVar16 < *(uint *)((long)plVar3 + 0x1c); uVar16 = uVar16 + 1) {
          iVar13 = *(int *)(*plVar3 + uVar16 * 4);
          if (iVar13 != -1) {
            while (iVar13 != -1) {
              lVar12 = (long)iVar13;
              iVar13 = *(int *)(plVar3[1] + 8 + lVar12 * 0x18);
              anon_func::anon_class_32_1_3fcf6586::anon_class_32_1_3fcf6586_for_fn::
              anon_class_32_1_3fcf6586_for_fn::anon_class_32_1_3fcf6586_for_fn::operator()
                        (&local_c0,(void **)(plVar3[1] + lVar12 * 0x18));
            }
          }
        }
        value = (void **)(plVar3 + 7);
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        pMVar8 = multiBranchInstr;
        *(undefined4 *)&(multiBranchInstr->super_BranchInstr).super_Instr._vptr_Instr = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x435,"(false)","false");
        if (!bVar5) goto LAB_0048f94e;
        *(undefined4 *)&(pMVar8->super_BranchInstr).super_Instr._vptr_Instr = 0;
        value = (void **)0x0;
      }
      anon_func::anon_class_32_1_3fcf6586::anon_class_32_1_3fcf6586_for_fn::
      anon_class_32_1_3fcf6586_for_fn::anon_class_32_1_3fcf6586_for_fn::operator()(&local_a0,value);
      pBVar17 = local_80;
      pMVar8 = multiBranchInstr;
      uVar7 = branchInstr._4_4_;
    }
  }
  else {
    _offset = CreateLabel(this,(BranchInstr *)local_48,(uint *)&branchInstr);
    IR::BranchInstr::SetTarget((BranchInstr *)local_48,_offset);
    uVar7 = (uint)branchInstr;
  }
  if ((pBVar17->isNotBackEdge == false) && (uVar7 <= local_4c)) {
    bVar1 = _offset->field_0x78;
    _offset->field_0x78 = bVar1 | 1;
    bVar5 = Func::IsJitInDebugMode(this->m_func);
    if (bVar5) {
      pBVar10 = pBVar17->branchInstr;
      byteCodeOffset = IR::Instr::GetByteCodeOffset(&pBVar10->super_Instr);
      InsertBailOutForDebugger
                (this,byteCodeOffset,BailOutBreakPointInFunction|BailOutForceByFlag,
                 &pBVar10->super_Instr);
    }
    if (((bVar1 & 1) == 0) && (this->m_loopCounterSym != (StackSym *)0x0)) {
      InsertIncrLoopBodyLoopCounter(this,_offset);
    }
  }
  goto LAB_0048f63a;
}

Assistant:

void
IRBuilder::InsertLabels()
{
    AssertMsg(this->branchRelocList, "Malformed branch reloc list");

    SList<BranchReloc *>::Iterator iter(this->branchRelocList);

    while (iter.Next())
    {
        IR::LabelInstr * labelInstr = nullptr;
        BranchReloc * reloc = iter.Data();
        IR::BranchInstr * branchInstr = reloc->GetBranchInstr();
        uint offset = reloc->GetOffset();
        uint const branchOffset = reloc->GetBranchOffset();

        Assert(!IsLoopBody() || offset <= GetLoopBodyExitInstrOffset());

        if(branchInstr->m_opcode == Js::OpCode::MultiBr)
        {
            IR::MultiBranchInstr * multiBranchInstr = branchInstr->AsBranchInstr()->AsMultiBrInstr();

            multiBranchInstr->UpdateMultiBrTargetOffsets([&](uint32 offset) -> IR::LabelInstr *
            {
                labelInstr = this->CreateLabel(branchInstr, offset);
                multiBranchInstr->ChangeLabelRef(nullptr, labelInstr);
                return labelInstr;
            });
        }
        else
        {
            labelInstr = this->CreateLabel(branchInstr, offset);
            branchInstr->SetTarget(labelInstr);
        }

        if (!reloc->IsNotBackEdge() && branchOffset >= offset)
        {
            bool wasLoopTop = labelInstr->m_isLoopTop;
            labelInstr->m_isLoopTop = true;

            if (m_func->IsJitInDebugMode())
            {
                // Add bailout for Async Break.
                IR::BranchInstr* backEdgeBranchInstr = reloc->GetBranchInstr();
                this->InsertBailOutForDebugger(backEdgeBranchInstr->GetByteCodeOffset(), IR::BailOutForceByFlag | IR::BailOutBreakPointInFunction, backEdgeBranchInstr);
            }

            if (!wasLoopTop && m_loopCounterSym)
            {
                this->InsertIncrLoopBodyLoopCounter(labelInstr);
            }

        }
    }
}